

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_binary_func_op_cast
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          char *op,BaseType input_type,bool skip_cast_if_equal_type)

{
  __node_base_ptr *cast_op1_00;
  uint32_t result_id_00;
  uint32_t result_type_00;
  bool bVar1;
  uint uVar2;
  undefined4 in_stack_fffffffffffffd64;
  bool local_295;
  string local_258;
  string local_238;
  string local_218 [32];
  undefined1 local_1f8 [8];
  string expr;
  SPIRType *out_type;
  undefined1 local_1c0 [8];
  SPIRType expected_type;
  string cast_op1;
  string cast_op0;
  char *pcStack_28;
  bool skip_cast_if_equal_type_local;
  char *op_local;
  uint32_t op1_local;
  uint32_t op0_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  bVar1 = skip_cast_if_equal_type;
  pcStack_28 = op;
  op_local._0_4_ = op1;
  op_local._4_4_ = op0;
  op1_local = result_id;
  op0_local = result_type;
  _result_id_local = this;
  ::std::__cxx11::string::string((string *)(cast_op1.field_2._M_local_buf + 8));
  cast_op1_00 = &expected_type.member_name_cache._M_h._M_single_bucket;
  ::std::__cxx11::string::string((string *)cast_op1_00);
  uVar2 = bVar1 & 1;
  binary_op_bitcast_helper
            ((SPIRType *)local_1c0,this,(string *)(cast_op1.field_2._M_local_buf + 8),
             (string *)cast_op1_00,&input_type,op_local._4_4_,(uint32_t)op_local,SUB41(uVar2,0));
  expr.field_2._8_8_ = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,op0_local);
  ::std::__cxx11::string::string((string *)local_1f8);
  if ((*(BaseType *)(expr.field_2._8_8_ + 0x10) == input_type) ||
     (*(int *)(expr.field_2._8_8_ + 0x10) == 2)) {
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
              (&local_258,(spirv_cross *)&stack0xffffffffffffffd8,(char **)0x4a488c,
               (char (*) [2])((long)&cast_op1.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a12ae,
               (char (*) [3])&expected_type.member_name_cache._M_h._M_single_bucket,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4b01ae,
               (char (*) [2])CONCAT44(in_stack_fffffffffffffd64,uVar2));
    ::std::__cxx11::string::operator+=((string *)local_1f8,(string *)&local_258);
    ::std::__cxx11::string::~string((string *)&local_258);
  }
  else {
    expected_type.super_IVariant.self.id = input_type;
    (*(this->super_Compiler)._vptr_Compiler[0x3b])(local_218,this,expr.field_2._8_8_,local_1c0);
    ::std::__cxx11::string::operator=((string *)local_1f8,local_218);
    ::std::__cxx11::string::~string(local_218);
    ::std::__cxx11::string::operator+=((string *)local_1f8,'(');
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
              (&local_238,(spirv_cross *)&stack0xffffffffffffffd8,(char **)0x4a488c,
               (char (*) [2])((long)&cast_op1.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a12ae,
               (char (*) [3])&expected_type.member_name_cache._M_h._M_single_bucket,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4b01ae,
               (char (*) [2])CONCAT44(in_stack_fffffffffffffd64,uVar2));
    ::std::__cxx11::string::operator+=((string *)local_1f8,(string *)&local_238);
    ::std::__cxx11::string::~string((string *)&local_238);
    ::std::__cxx11::string::operator+=((string *)local_1f8,')');
  }
  result_type_00 = op0_local;
  result_id_00 = op1_local;
  bVar1 = should_forward(this,op_local._4_4_);
  local_295 = false;
  if (bVar1) {
    local_295 = should_forward(this,(uint32_t)op_local);
  }
  emit_op(this,result_type_00,result_id_00,(string *)local_1f8,local_295,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,op1_local,op_local._4_4_);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,op1_local,(uint32_t)op_local);
  ::std::__cxx11::string::~string((string *)local_1f8);
  SPIRType::~SPIRType((SPIRType *)local_1c0);
  ::std::__cxx11::string::~string((string *)&expected_type.member_name_cache._M_h._M_single_bucket);
  ::std::__cxx11::string::~string((string *)(cast_op1.field_2._M_local_buf + 8));
  return;
}

Assistant:

void CompilerGLSL::emit_binary_func_op_cast(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                            const char *op, SPIRType::BaseType input_type, bool skip_cast_if_equal_type)
{
	string cast_op0, cast_op1;
	auto expected_type = binary_op_bitcast_helper(cast_op0, cast_op1, input_type, op0, op1, skip_cast_if_equal_type);
	auto &out_type = get<SPIRType>(result_type);

	// Special case boolean outputs since relational opcodes output booleans instead of int/uint.
	string expr;
	if (out_type.basetype != input_type && out_type.basetype != SPIRType::Boolean)
	{
		expected_type.basetype = input_type;
		expr = bitcast_glsl_op(out_type, expected_type);
		expr += '(';
		expr += join(op, "(", cast_op0, ", ", cast_op1, ")");
		expr += ')';
	}
	else
	{
		expr += join(op, "(", cast_op0, ", ", cast_op1, ")");
	}

	emit_op(result_type, result_id, expr, should_forward(op0) && should_forward(op1));
	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
}